

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

BytePtr stackjit::Runtime::getVirtualFunctionAddress(RawClassRef rawClassRef,int index)

{
  pointer pcVar1;
  ObjectRef objRef_00;
  ClassMetadata *pCVar2;
  BytePtr *ppuVar3;
  string *psVar4;
  ExecutionEngine *this;
  JitFunction p_Var5;
  JitFunction entryPoint;
  ObjectRef objRef;
  ClassRef classRef;
  JitFunction local_78;
  ClassType *pCStack_70;
  size_t local_68;
  string local_58;
  ClassRef local_38;
  
  VMState::gc(Internal::vmState);
  ObjectRef::ObjectRef((ObjectRef *)&local_58,rawClassRef);
  local_78 = (JitFunction)local_58._M_dataplus._M_p;
  pCStack_70 = (ClassType *)local_58._M_string_length;
  local_68 = local_58.field_2._M_allocated_capacity;
  pCVar2 = ClassType::metadata((ClassType *)local_58._M_string_length);
  objRef_00.mType = (Type *)pCStack_70;
  objRef_00.mPtr = (BytePtr)local_78;
  objRef_00.mSize = local_68;
  ClassRef::ClassRef(&local_38,objRef_00,pCVar2);
  pCVar2 = ClassType::metadata((ClassType *)local_38.mObjRef.mType);
  ppuVar3 = ClassMetadata::virtualFunctionTable(pCVar2);
  p_Var5 = (JitFunction)ppuVar3[index];
  if (p_Var5 == (JitFunction)0x0) {
    pCVar2 = ClassType::metadata((ClassType *)local_38.mObjRef.mType);
    psVar4 = ClassMetadata::getVirtualFunctionSignature_abi_cxx11_(pCVar2,index);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + psVar4->_M_string_length);
    local_78 = (JitFunction)0x0;
    this = VMState::engine(Internal::vmState);
    ExecutionEngine::compileFunction(this,&local_58,&local_78);
    p_Var5 = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return (BytePtr)p_Var5;
}

Assistant:

BytePtr Runtime::getVirtualFunctionAddress(RawClassRef rawClassRef, int index) {
		auto classRef = vmState()->gc().getClassRef(rawClassRef);
		auto classType = static_cast<const ClassType*>(classRef.objRef().type());
		auto funcPtr = classType->metadata()->virtualFunctionTable()[index];

		if (funcPtr != nullptr) {
			return funcPtr;
		} else {
			//Compile
			auto signature = classType->metadata()->getVirtualFunctionSignature(index);
			JitFunction entryPoint = nullptr;
			try {
				vmState()->engine().compileFunction(signature, entryPoint);
			} catch (std::runtime_error& e) {
				std::cout << e.what() << std::endl;
				exit(0);
			}

			return (BytePtr)entryPoint;
		}
	}